

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibrary::ResetIntlObject(JavascriptLibrary *this)

{
  Type *addr;
  Recycler *recycler;
  DynamicType *type;
  DynamicObject *pDVar1;
  
  recycler = this->recycler;
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Object,
                          (RecyclableObject *)
                          (this->super_JavascriptLibraryBase).objectPrototype.ptr,
                          (JavascriptMethod)0x0,
                          (DynamicTypeHandler *)
                          &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIntlObject,Js::DefaultDeferredTypeFilter,false,(unsigned_short)0,(unsigned_short)0>
                           ::defaultInstance,false,false);
  pDVar1 = DynamicObject::New(recycler,type);
  addr = &(this->super_JavascriptLibraryBase).IntlObject;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_JavascriptLibraryBase).IntlObject.ptr = pDVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void JavascriptLibrary::ResetIntlObject()
    {
        IntlObject = DynamicObject::New(
            recycler,
            DynamicType::New(scriptContext,
                             TypeIds_Object, objectPrototype, nullptr,
                             DeferredTypeHandler<InitializeIntlObject>::GetDefaultInstance()));
    }